

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::run(search *sch,multi_ex *ec)

{
  void *pvVar1;
  ostream *poVar2;
  stringstream *psVar3;
  bool isLdf;
  size_t i;
  ulong uVar4;
  size_t i_1;
  unsigned_long local_60;
  v_array<unsigned_long> predictions;
  
  pvVar1 = sch->task_data;
  predictions.end_array = (unsigned_long *)0x0;
  predictions.erase_count = 0;
  predictions._begin = (unsigned_long *)0x0;
  predictions._end = (unsigned_long *)0x0;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    local_60 = 0;
    v_array<unsigned_long>::push_back(&predictions,&local_60);
  }
  switch(*(undefined8 *)((long)pvVar1 + 0x58)) {
  case 0:
    isLdf = false;
    goto LAB_0022e62b;
  case 1:
    er_mixed_decoding(sch,ec,&predictions);
    break;
  case 2:
    er_allow_skip_decoding(sch,ec,&predictions);
    break;
  case 3:
    isLdf = true;
LAB_0022e62b:
    entity_first_decoding(sch,ec,&predictions,isLdf);
    break;
  default:
    poVar2 = std::operator<<((ostream *)&std::cerr,"search order ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"is undefined.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(ec->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    psVar3 = Search::search::output_abi_cxx11_(sch);
    if (*(int *)(psVar3 + *(long *)(*(long *)psVar3 + -0x18) + 0x20) == 0) {
      psVar3 = Search::search::output_abi_cxx11_(sch);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)(psVar3 + 0x10));
      std::operator<<(poVar2,' ');
    }
  }
  v_array<unsigned_long>::delete_v(&predictions);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  task_data* my_task_data = sch.get_task_data<task_data>();

  v_array<size_t> predictions = v_init<size_t>();
  for (size_t i = 0; i < ec.size(); i++)
  {
    predictions.push_back(0);
  }

  switch (my_task_data->search_order)
  {
    case 0:
      entity_first_decoding(sch, ec, predictions, false);
      break;
    case 1:
      er_mixed_decoding(sch, ec, predictions);
      break;
    case 2:
      er_allow_skip_decoding(sch, ec, predictions);
      break;
    case 3:
      entity_first_decoding(sch, ec, predictions, true);  // LDF = true
      break;
    default:
      cerr << "search order " << my_task_data->search_order << "is undefined." << endl;
  }

  for (size_t i = 0; i < ec.size(); i++)
  {
    if (sch.output().good())
      sch.output() << predictions[i] << ' ';
  }
  predictions.delete_v();
}